

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O0

void webrtc::ScaleErrorSignal(float mu,float error_threshold,float *x_pow,float (*ef) [65])

{
  float fVar1;
  int local_24;
  float abs_ef;
  int i;
  float (*ef_local) [65];
  float *x_pow_local;
  float error_threshold_local;
  float mu_local;
  
  for (local_24 = 0; local_24 < 0x41; local_24 = local_24 + 1) {
    (*ef)[local_24] = (*ef)[local_24] / (x_pow[local_24] + 1e-10);
    ef[1][local_24] = ef[1][local_24] / (x_pow[local_24] + 1e-10);
    fVar1 = sqrtf((*ef)[local_24] * (*ef)[local_24] + ef[1][local_24] * ef[1][local_24]);
    if (error_threshold < fVar1) {
      fVar1 = error_threshold / (fVar1 + 1e-10);
      (*ef)[local_24] = fVar1 * (*ef)[local_24];
      ef[1][local_24] = fVar1 * ef[1][local_24];
    }
    (*ef)[local_24] = mu * (*ef)[local_24];
    ef[1][local_24] = mu * ef[1][local_24];
  }
  return;
}

Assistant:

static void ScaleErrorSignal(float mu,
                             float error_threshold,
                             float x_pow[PART_LEN1],
                             float ef[2][PART_LEN1]) {
  int i;
  float abs_ef;
  for (i = 0; i < (PART_LEN1); i++) {
    ef[0][i] /= (x_pow[i] + 1e-10f);
    ef[1][i] /= (x_pow[i] + 1e-10f);
    abs_ef = sqrtf(ef[0][i] * ef[0][i] + ef[1][i] * ef[1][i]);

    if (abs_ef > error_threshold) {
      abs_ef = error_threshold / (abs_ef + 1e-10f);
      ef[0][i] *= abs_ef;
      ef[1][i] *= abs_ef;
    }

    // Stepsize factor
    ef[0][i] *= mu;
    ef[1][i] *= mu;
  }
}